

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnMemoryInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *memidx)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  MemoryType mt;
  Limits local_d8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0xcf,loc);
  local_d8.initial = 0;
  local_d8.max._0_7_ = 0;
  local_d8._15_4_ = 0;
  Var::Var(&local_78,memidx);
  RVar2 = CheckMemoryIndex(this,&local_78,(MemoryType *)&local_d8);
  Var::~Var(&local_78);
  Var::Var(&local_c0,segment_var);
  RVar3 = CheckDataSegmentIndex(this,&local_c0);
  Var::~Var(&local_c0);
  if (segment_var->type_ == Index) {
    RVar4 = TypeChecker::OnMemoryInit(&this->typechecker_,(segment_var->field_2).index_,&local_d8);
    RVar1.enum_._0_1_ =
         RVar4.enum_ == Error ||
         (RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnMemoryInit(const Location& loc,
                                     Var segment_var,
                                     Var memidx) {
  Result result = CheckInstr(Opcode::MemoryInit, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnMemoryInit(segment_var.index(), mt.limits);
  return result;
}